

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O2

int CVmObjString::const_get_prop
              (vm_val_t *retval,vm_val_t *self_val,char *str,vm_prop_id_t prop,vm_obj_id_t *src_obj,
              uint *argc)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  
  *src_obj = 0;
  uVar1 = CVmMetaTable::prop_to_vector_idx(G_meta_table_X,metaclass_reg_->meta_reg_idx_,prop);
  iVar2 = (*func_table_[uVar1])(retval,self_val,str,argc);
  iVar3 = 1;
  if (iVar2 == 0) {
    if ((self_val->typ != VM_OBJ) &&
       (iVar3 = CVmObject::get_prop((CVmObject *)
                                    (G_obj_table_X.pages_[G_predef_X.const_str_obj >> 0xc] +
                                    (G_predef_X.const_str_obj & 0xfff)),prop,retval,
                                    G_predef_X.const_str_obj,src_obj,argc), iVar3 != 0)) {
      return 1;
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int CVmObjString::const_get_prop(VMG_ vm_val_t *retval,
                                 const vm_val_t *self_val, const char *str,
                                 vm_prop_id_t prop, vm_obj_id_t *src_obj,
                                 uint *argc)
{
    /* presume no source object */
    *src_obj = VM_INVALID_OBJ;

    /* translate the property index to an index into our function table */
    uint func_idx = G_meta_table
               ->prop_to_vector_idx(metaclass_reg_->get_reg_idx(), prop);

    /* call the appropriate function */
    if ((*func_table_[func_idx])(vmg_ retval, self_val, str, argc))
        return TRUE;

    /* 
     *   If this is a constant string (which is indicated by an invalid
     *   'self' object ID), try inheriting the default object
     *   interpretation, passing the constant string placeholder object
     *   for its type information.  
     */
    if (self_val->typ != VM_OBJ)
    {
        /* try going to CVmObject directly */
        if (vm_objp(vmg_ G_predef->const_str_obj)
            ->CVmObject::get_prop(vmg_ prop, retval, G_predef->const_str_obj,
                                  src_obj, argc))
            return TRUE;
    }

    /* not handled */
    return FALSE;
}